

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::SPxQuicksort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start,bool type)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  Compare<double> *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  double dVar3;
  int mid;
  int hi;
  int lo;
  int tmp;
  int pivotkey;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  bool bVar4;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar5;
  int iVar6;
  int end_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar7;
  
  uVar1 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    iVar2 = in_ESI + -1;
    while (uVar5 = uVar1 & 0x1ffffff, 0x18 < iVar2 - in_ECX) {
      in_stack_ffffffffffffffcc = in_ECX + (iVar2 - in_ECX) / 2;
      in_stack_ffffffffffffffdc = *(int *)(in_RDI + (long)in_stack_ffffffffffffffcc * 4);
      in_stack_ffffffffffffffd0 = iVar2;
      in_stack_ffffffffffffffd4 = in_ECX;
      iVar6 = in_ECX;
      iVar7 = iVar2;
      while( true ) {
        if ((uVar5 & 0x1000000) == 0) {
          while( true ) {
            bVar4 = false;
            if (in_stack_ffffffffffffffd4 < iVar7) {
              dVar3 = Compare<double>::operator()
                                (in_RDX,*(int *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4),
                                 in_stack_ffffffffffffffdc);
              bVar4 = dVar3 <= 0.0;
            }
            if (!bVar4) break;
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
          }
          while( true ) {
            bVar4 = false;
            if (iVar6 < in_stack_ffffffffffffffd0) {
              dVar3 = Compare<double>::operator()
                                (in_RDX,*(int *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4),
                                 in_stack_ffffffffffffffdc);
              bVar4 = 0.0 < dVar3;
            }
            if (!bVar4) break;
            in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1;
          }
        }
        else {
          while( true ) {
            bVar4 = false;
            if (in_stack_ffffffffffffffd4 < iVar7) {
              dVar3 = Compare<double>::operator()
                                (in_RDX,*(int *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4),
                                 in_stack_ffffffffffffffdc);
              bVar4 = dVar3 < 0.0;
            }
            if (!bVar4) break;
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
          }
          while( true ) {
            bVar4 = false;
            if (iVar6 < in_stack_ffffffffffffffd0) {
              dVar3 = Compare<double>::operator()
                                (in_RDX,*(int *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4),
                                 in_stack_ffffffffffffffdc);
              bVar4 = 0.0 <= dVar3;
            }
            if (!bVar4) break;
            in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1;
          }
        }
        if (in_stack_ffffffffffffffd0 <= in_stack_ffffffffffffffd4) break;
        in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4);
        *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4) =
             *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4);
        *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4) = in_stack_ffffffffffffffd8;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1;
      }
      if ((uVar5 & 0x1000000) == 0) {
        while( true ) {
          bVar4 = false;
          if (iVar6 < in_stack_ffffffffffffffd0) {
            dVar3 = Compare<double>::operator()
                              (in_RDX,in_stack_ffffffffffffffdc,
                               *(int *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4));
            bVar4 = dVar3 <= 0.0;
          }
          if (!bVar4) break;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1;
        }
        if (in_stack_ffffffffffffffd0 == iVar7) {
          in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4);
          *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd0 * 4) =
               *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffcc * 4);
          *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffcc * 4) = in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + -1;
        }
      }
      else {
        while( true ) {
          bVar4 = false;
          if (in_stack_ffffffffffffffd4 < iVar7) {
            dVar3 = Compare<double>::operator()
                              (in_RDX,in_stack_ffffffffffffffdc,
                               *(int *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4));
            bVar4 = 0.0 <= dVar3;
          }
          if (!bVar4) break;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
        }
        if (in_stack_ffffffffffffffd4 == iVar6) {
          in_stack_ffffffffffffffd8 = *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4);
          *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffd4 * 4) =
               *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffcc * 4);
          *(undefined4 *)(in_RDI + (long)in_stack_ffffffffffffffcc * 4) = in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
        }
      }
      bVar4 = SUB41((uint)in_stack_ffffffffffffffd8 >> 0x18,0);
      end_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar7 - in_stack_ffffffffffffffd4 < in_stack_ffffffffffffffd0 - iVar6) {
        in_ECX = iVar6;
        iVar2 = in_stack_ffffffffffffffd0;
        if (in_stack_ffffffffffffffd4 < iVar7) {
          SPxQuicksort<int,soplex::Compare<double>>
                    ((int *)CONCAT44(iVar7,in_stack_fffffffffffffff0),end_00,
                     (Compare<double> *)CONCAT44(iVar6,uVar5),in_stack_ffffffffffffffdc,bVar4);
          in_ECX = iVar6;
          iVar2 = in_stack_ffffffffffffffd0;
        }
      }
      else {
        in_ECX = in_stack_ffffffffffffffd4;
        iVar2 = iVar7;
        if (iVar6 < in_stack_ffffffffffffffd0) {
          SPxQuicksort<int,soplex::Compare<double>>
                    ((int *)CONCAT44(iVar7,in_stack_fffffffffffffff0),end_00,
                     (Compare<double> *)CONCAT44(iVar6,uVar5),in_stack_ffffffffffffffdc,bVar4);
          in_ECX = in_stack_ffffffffffffffd4;
          iVar2 = iVar7;
        }
      }
      uVar1 = uVar5 ^ 0xff000000;
    }
    if (0 < iVar2 - in_ECX) {
      SPxShellsort<int,soplex::Compare<double>>
                ((int *)(CONCAT44(in_ECX,uVar1) & 0xffffffff01ffffff),in_stack_ffffffffffffffdc,
                 (Compare<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}